

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::printInfo(Chromosome *this)

{
  ostream *poVar1;
  json j_vec;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"### Bester Kandidat ###");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Pairs: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Collisions: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->collisions);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Fitness: ");
  poVar1 = std::ostream::_M_insert<double>(this->fitness);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ID: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->id);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"#######################");
  std::endl<char,std::char_traits<char>>(poVar1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::basic_json<std::vector<TURNCODE,_std::allocator<TURNCODE>_>,_0>(&j_vec,&this->turnList);
  poVar1 = nlohmann::operator<<((ostream *)&std::cout,&j_vec);
  std::endl<char,std::char_traits<char>>(poVar1);
  printCoordinates(this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json(&j_vec);
  return;
}

Assistant:

void Chromosome::printInfo() {
    std::cout << "### Bester Kandidat ###" << std::endl;
    std::cout << "Pairs: " << pairs.size() << std::endl;
    std::cout << "Collisions: " << collisions << std::endl;
    std::cout << "Fitness: " << fitness << std::endl;
    std::cout << "ID: " << id << std::endl;
    std::cout << "#######################" << std::endl;

    json j_vec(turnList);
    std::cout << j_vec << std::endl;
    printCoordinates();

}